

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_plan_generator.cpp
# Opt level: O3

unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true> __thiscall
duckdb::PhysicalPlanGenerator::Plan
          (PhysicalPlanGenerator *this,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *op)

{
  PhysicalOperator *pPVar1;
  long *in_RDX;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_28;
  
  local_28._M_head_impl = (LogicalOperator *)*in_RDX;
  *in_RDX = 0;
  pPVar1 = ResolveAndPlan((PhysicalPlanGenerator *)op,
                          (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                           *)&local_28);
  if (local_28._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_28._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  local_28._M_head_impl = (LogicalOperator *)0x0;
  (*pPVar1->_vptr_PhysicalOperator[7])(pPVar1);
  (this->dependencies).set._M_h._M_buckets =
       (__buckets_ptr)
       op[0x1e].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  op[0x1e].super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
  _M_t.super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl = (LogicalOperator *)0x0;
  return (unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_>)
         (unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>_>)this;
}

Assistant:

unique_ptr<PhysicalPlan> PhysicalPlanGenerator::Plan(unique_ptr<LogicalOperator> op) {
	auto &plan = ResolveAndPlan(std::move(op));
	plan.Verify();
	return std::move(physical_plan);
}